

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

void Dch_DeriveChoiceAigNode
               (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Aig_Obj_t *pObj,int fSkipRedSupps)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObjNew2;
  Aig_Obj_t *pAVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                  ,0x1be,"void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)")
    ;
  }
  bVar2 = true;
  if ((pAigOld->pReprs == (Aig_Obj_t **)0x0) ||
     (pAVar7 = pAigOld->pReprs[pObj->Id], pAVar7 == (Aig_Obj_t *)0x0)) {
    pAVar7 = (Aig_Obj_t *)0x0;
  }
  else {
    iVar3 = Aig_ObjIsConst1(pAVar7);
    if ((iVar3 != 0) || ((*(uint *)&pAVar7->field_0x18 & 7) == 2)) {
      if ((pAVar7->field_5).pData != (void *)0x0) {
        (pObj->field_5).pData =
             (void *)((ulong)((*(uint *)&pAVar7->field_0x18 ^ *(uint *)&pObj->field_0x18) >> 3 & 1)
                     ^ (ulong)(pAVar7->field_5).pData);
        return;
      }
      __assert_fail("pRepr->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                    ,0x1c3,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    bVar2 = false;
  }
  pAVar4 = Aig_ObjChild0CopyRepr(pAigNew,pObj);
  uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
  if (uVar5 == 0) {
    pAVar6 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar6 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar5 + 0x28));
  }
  pAVar6 = Aig_ObjGetRepr(pAigNew,pAVar6);
  pAVar4 = Aig_And(pAigNew,pAVar4,pAVar6);
  do {
    pAVar6 = pAVar4;
    pAVar4 = Aig_ObjGetRepr(pAigNew,pAVar6);
  } while (pAVar4 != pAVar6);
  if ((pObj->field_5).pData == (void *)0x0) {
    (pObj->field_5).pData = pAVar4;
    if (!bVar2) {
      if (pObj->Id <= pAVar7->Id) {
        __assert_fail("pRepr->Id < pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                      ,0x1da,
                      "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
      }
      if ((*(uint *)&pAVar7->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pRepr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                      ,0x1db,
                      "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
      }
      pAVar6 = (Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe);
      pAVar7 = (Aig_Obj_t *)((ulong)(pAVar7->field_5).pData & 0xfffffffffffffffe);
      if (pAVar7->Id < pAVar6->Id) {
        if (pAigNew->pReprs == (Aig_Obj_t **)0x0) {
          __assert_fail("p->pReprs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        pAigNew->pReprs[pAVar6->Id] = pAVar7;
        if (((*(uint *)&pAVar6->field_0x18 & 0xffffffc0) == 0) &&
           (iVar3 = Dch_ObjCheckTfi(pAigNew,pAVar6,pAVar7), iVar3 == 0)) {
          if ((fSkipRedSupps != 0) &&
             (iVar3 = Dch_ObjCheckSuppRed(pAigNew,pAVar6,pAVar7), iVar3 != 0)) {
            return;
          }
          do {
            piVar1 = &pAVar7->Id;
            pAVar7 = pAigNew->pEquivs[*piVar1];
          } while (pAVar7 != (Aig_Obj_t *)0x0);
          pAigNew->pEquivs[*piVar1] = pAVar6;
        }
      }
    }
    return;
  }
  __assert_fail("pObj->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                ,0x1d5,"void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

void Dch_DeriveChoiceAigNode( Aig_Man_t * pAigNew, Aig_Man_t * pAigOld, Aig_Obj_t * pObj, int fSkipRedSupps )
{
    Aig_Obj_t * pRepr, * pObjNew, * pReprNew;
    assert( !Aig_IsComplement(pObj) );
    // get the representative
    pRepr = Aig_ObjRepr( pAigOld, pObj );
    if ( pRepr != NULL && (Aig_ObjIsConst1(pRepr) || Aig_ObjIsCi(pRepr)) )
    {
        assert( pRepr->pData != NULL );
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pObj->fPhase ^ pRepr->fPhase );
        return;
    }
    // get the new node
    pObjNew = Aig_And( pAigNew, 
        Aig_ObjChild0CopyRepr(pAigNew, pObj), 
        Aig_ObjChild1CopyRepr(pAigNew, pObj) );
//    pObjNew = Aig_ObjGetRepr( pAigNew, pObjNew );
    while ( 1 ) 
    {
        Aig_Obj_t * pObjNew2 = pObjNew;
        pObjNew = Aig_ObjGetRepr( pAigNew, pObjNew2 );
        if ( pObjNew == pObjNew2 )
            break;
    }
//    assert( Aig_ObjRepr( pAigNew, pObjNew ) == NULL );
    // assign the copy
    assert( pObj->pData == NULL );
    pObj->pData = pObjNew;
    // skip those without reprs
    if ( pRepr == NULL )
        return;
    assert( pRepr->Id < pObj->Id );
    assert( Aig_ObjIsNode(pRepr) );
    // get the corresponding new nodes
    pObjNew  = Aig_Regular((Aig_Obj_t *)pObj->pData);
    pReprNew = Aig_Regular((Aig_Obj_t *)pRepr->pData);
    // skip earlier nodes
    if ( pReprNew->Id >= pObjNew->Id )
        return;
    assert( pReprNew->Id < pObjNew->Id );
    // set the representatives
    Aig_ObjSetRepr( pAigNew, pObjNew, pReprNew );
    // skip used nodes
    if ( pObjNew->nRefs > 0 )
        return;
    assert( pObjNew->nRefs == 0 );
    // skip choices that can lead to combo loops
    if ( Dch_ObjCheckTfi( pAigNew, pObjNew, pReprNew ) )
        return;
    // don't add choice if structural support of pObjNew and pReprNew differ
    if ( fSkipRedSupps && Dch_ObjCheckSuppRed(pAigNew, pObjNew, pReprNew) )
        return;
    // add choice to the end of the list
    while ( pAigNew->pEquivs[pReprNew->Id] != NULL )
        pReprNew = pAigNew->pEquivs[pReprNew->Id];
    assert( pAigNew->pEquivs[pReprNew->Id] == NULL );
    pAigNew->pEquivs[pReprNew->Id] = pObjNew;
}